

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void __thiscall
TLaplaceExample1::uxy<Fad<double>>
          (TLaplaceExample1 *this,TPZVec<Fad<double>_> *x,TPZVec<Fad<double>_> *disp)

{
  uint uVar1;
  long lVar2;
  int64_t iVar3;
  double *val;
  Fad<double> *pFVar4;
  TPZVec<Fad<double>_> *in_RDX;
  TPZVec<Fad<double>_> *in_RSI;
  long in_RDI;
  double __y;
  double __y_00;
  REAL RVar5;
  double __y_01;
  double __y_02;
  double __y_03;
  FadExpr<FadFuncSqrt<Fad<double>_>_> *e;
  double __y_04;
  double in_XMM1_Qa;
  Fad<double> ck;
  Fad<double> kpi;
  int k;
  Fad<double> Ck;
  Fad<double> theta_4;
  Fad<double> r_3;
  Fad<double> theta_3;
  Fad<double> r_2;
  Fad<double> theta_2;
  Fad<double> r_1;
  Fad<double> alpha;
  Fad<double> a1;
  Fad<double> theta_1;
  Fad<double> coef;
  Fad<double> factor_1;
  Fad<double> term2;
  Fad<double> term1;
  Fad<double> u2_3;
  Fad<double> u1_3;
  Fad<double> u2_2;
  Fad<double> u1_2;
  Fad<double> u2_1;
  Fad<double> u1_1;
  Fad<double> u2;
  Fad<double> u1;
  Fad<double> k2;
  Fad<double> k1;
  REAL tval;
  Fad<double> t;
  Fad<double> lambda;
  Fad<double> coefs [8];
  Fad<double> factor;
  REAL thetaval;
  Fad<double> theta;
  Fad<double> temp;
  int i_7;
  Fad<double> Prod;
  Fad<double> arc;
  Fad<double> Force;
  Fad<double> RCircle;
  REAL B;
  Fad<double> mult;
  Fad<double> freq;
  Fad<double> atanco;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  REAL xval [2];
  Fad<double> r;
  int i_1;
  Fad<double> r2;
  int i;
  TPZManVector<Fad<double>,_3> xloc;
  Fad<double> *in_stack_ffffffffffffd640;
  Fad<double> *in_stack_ffffffffffffd648;
  TPZManVector<Fad<double>,_3> *in_stack_ffffffffffffd650;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *in_stack_ffffffffffffd658;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
  *fadexpr;
  Fad<double> *in_stack_ffffffffffffd660;
  Fad<double> *in_stack_ffffffffffffd668;
  FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_> *expr;
  Fad<double> *in_stack_ffffffffffffd670;
  Fad<double> *in_stack_ffffffffffffd678;
  Fad<double> *in_stack_ffffffffffffd680;
  Fad<double> *in_stack_ffffffffffffd688;
  Fad<double> *pFVar6;
  Fad<double> *in_stack_ffffffffffffd690;
  Fad<double> *in_stack_ffffffffffffd698;
  Fad<double> *in_stack_ffffffffffffd6a0;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffd6e8;
  TPZManVector<Fad<double>,_3> *in_stack_ffffffffffffd6f0;
  TPZVec<Fad<double>_> *this_00;
  undefined8 *local_28b8;
  int local_25d4;
  double local_2528 [13];
  Fad<double> local_24c0 [8];
  double local_23b8 [13];
  Fad<double> local_2350 [23];
  undefined8 local_2070;
  undefined8 local_2048;
  undefined8 local_1f80;
  undefined8 local_1f30;
  undefined8 local_1e60;
  undefined8 local_1e08;
  undefined8 local_1dd0;
  undefined8 local_1d68;
  undefined8 local_1d30;
  undefined8 local_1cf8;
  undefined4 local_1c4c;
  undefined8 local_1c28;
  undefined8 local_1bd8;
  undefined8 local_1ab8;
  undefined8 local_1a80;
  undefined8 local_1a18;
  undefined8 local_19d0;
  undefined8 local_1958;
  undefined8 local_1920;
  undefined8 local_1860;
  undefined8 local_1828;
  undefined8 local_17c0;
  undefined8 local_1778;
  undefined8 local_1700;
  undefined8 local_16c8;
  undefined8 local_1618;
  undefined8 local_15e0;
  undefined8 local_1588;
  undefined8 local_1550;
  undefined8 local_14d8;
  undefined8 local_14a0;
  undefined8 local_13e0;
  undefined8 local_13a8;
  undefined8 local_1350;
  undefined8 local_1318;
  undefined8 local_1288;
  undefined4 local_11e4;
  undefined4 local_11bc;
  double local_e18 [5];
  REAL local_df0;
  Fad<double> local_da8;
  undefined8 local_d88;
  undefined8 local_d60;
  undefined8 local_d58;
  undefined8 local_d50;
  undefined8 local_d48;
  undefined8 local_d40;
  undefined8 local_d38;
  undefined8 local_d30;
  undefined8 local_d28;
  undefined8 *local_d20;
  undefined8 local_d18 [4];
  undefined1 local_cf8 [32];
  undefined1 local_cd8 [32];
  undefined1 local_cb8 [32];
  undefined1 local_c98 [32];
  undefined1 local_c78 [32];
  undefined1 local_c58 [32];
  undefined1 local_c38 [32];
  undefined8 local_c18 [9];
  undefined8 local_bd0;
  undefined8 local_b98;
  undefined8 local_b30;
  undefined8 local_aa8;
  undefined8 local_a80;
  undefined8 local_a10;
  undefined8 local_9e8;
  undefined8 local_980;
  double local_978 [5];
  REAL local_950;
  Fad<double> local_908 [6];
  int local_82c;
  undefined8 local_828;
  undefined8 local_7b0;
  undefined8 local_788;
  undefined8 local_760;
  undefined8 local_720;
  undefined8 local_6c0;
  undefined4 local_684;
  undefined8 local_650;
  undefined8 local_5f0;
  undefined4 local_5b4;
  undefined8 local_550;
  undefined8 local_528;
  undefined8 local_4b8;
  int local_454;
  undefined8 local_450;
  undefined8 local_428;
  int local_3b4;
  undefined8 local_3b0;
  undefined8 local_388;
  int local_314;
  undefined8 local_310;
  undefined8 local_2e8;
  int local_274;
  undefined8 local_270;
  undefined8 local_248;
  int local_1f4;
  undefined8 local_1f0;
  REAL local_188;
  REAL local_180;
  undefined8 local_170;
  int local_dc;
  undefined8 local_d8;
  int local_9c;
  TPZVec<Fad<double>_> local_98 [4];
  TPZVec<Fad<double>_> *local_18;
  TPZVec<Fad<double>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_ffffffffffffd6f0,in_stack_ffffffffffffd6e8);
  for (local_9c = 0; lVar2 = (long)local_9c, iVar3 = TPZVec<Fad<double>_>::size(local_98),
      lVar2 < iVar3; local_9c = local_9c + 1) {
    val = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x18),(long)local_9c);
    pFVar4 = TPZVec<Fad<double>_>::operator[](local_98,(long)local_9c);
    Fad<double>::operator-=(pFVar4,val);
  }
  local_d8 = 0;
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
  for (local_dc = 0; local_dc < *(int *)(in_RDI + 0xc); local_dc = local_dc + 1) {
    TPZVec<Fad<double>_>::operator[](local_98,(long)local_dc);
    TPZVec<Fad<double>_>::operator[](local_98,(long)local_dc);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    Fad<double>::operator+=
              (in_stack_ffffffffffffd670,
               (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
  }
  sqrt<double>(in_stack_ffffffffffffd678);
  Fad<double>::Fad<FadFuncSqrt<Fad<double>>>
            (in_stack_ffffffffffffd690,
             (FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_ffffffffffffd688);
  FadExpr<FadFuncSqrt<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_ffffffffffffd640);
  TPZVec<Fad<double>_>::operator[](local_98,0);
  local_170 = 0;
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
  TPZVec<Fad<double>_>::operator[](local_18,0);
  Fad<double>::operator=
            (in_stack_ffffffffffffd660,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd658);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
  Fad<double>::~Fad(in_stack_ffffffffffffd640);
  TPZVec<Fad<double>_>::operator[](local_10,0);
  Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
  local_188 = shapeFAD::val<Fad<double>>((Fad<double> *)0x1e90999);
  TPZVec<Fad<double>_>::operator[](local_10,1);
  Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
  local_180 = shapeFAD::val<Fad<double>>((Fad<double> *)0x1e909eb);
  Fad<double>::~Fad(in_stack_ffffffffffffd640);
  Fad<double>::~Fad(in_stack_ffffffffffffd640);
  uVar1 = *(int *)(in_RDI + 0x10) - 1;
  if (uVar1 < 0x16 || *(int *)(in_RDI + 0x10) == 0x17) {
    switch((long)&switchD_01e90a47::switchdataD_020d7164 +
           (long)(int)(&switchD_01e90a47::switchdataD_020d7164)[uVar1]) {
    case 0x1e90af7:
      pFVar4 = TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator+=(pFVar4,&gC);
      break;
    case 0x1e90b1c:
      TPZVec<Fad<double>_>::operator[](local_98,0);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator+=<double,_nullptr>(in_stack_ffffffffffffd670,in_stack_ffffffffffffd668);
      break;
    case 0x1e90b69:
      local_1f0 = 0x3ff0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator+=<double,_nullptr>(in_stack_ffffffffffffd670,in_stack_ffffffffffffd668);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      for (local_1f4 = 0; local_1f4 < *(int *)(in_RDI + 0xc); local_1f4 = local_1f4 + 1) {
        local_248 = 0x400921fb54442d18;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        TPZVec<Fad<double>_>::operator[](local_98,(long)local_1f4);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        sin<FadBinaryMul<Fad<double>,Fad<double>>>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator*=
                  (in_stack_ffffffffffffd6a0,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd698);
        FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
      }
      break;
    case 0x1e90d4b:
      local_270 = 0x3ff0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator+=<double,_nullptr>(in_stack_ffffffffffffd670,in_stack_ffffffffffffd668);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      for (local_274 = 0; local_274 < *(int *)(in_RDI + 0xc); local_274 = local_274 + 1) {
        local_2e8 = 0x400921fb54442d18;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        TPZVec<Fad<double>_>::operator[](local_98,(long)local_274);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd698,
                   (double)in_stack_ffffffffffffd690);
        sin<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadCst<double>>>
                  ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)in_stack_ffffffffffffd678);
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator*=
                  (in_stack_ffffffffffffd6a0,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffd698);
        FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
        ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
      }
      break;
    case 0x1e90f7c:
      local_310 = 0x3ff0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator+=<double,_nullptr>(in_stack_ffffffffffffd670,in_stack_ffffffffffffd668);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      for (local_314 = 0; local_314 < *(int *)(in_RDI + 0xc); local_314 = local_314 + 1) {
        local_388 = 0x400921fb54442d18;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        TPZVec<Fad<double>_>::operator[](local_98,(long)local_314);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd698,
                   (double)in_stack_ffffffffffffd690);
        sin<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadCst<double>>>
                  ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)in_stack_ffffffffffffd678);
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator*=
                  (in_stack_ffffffffffffd6a0,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffd698);
        FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
        ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
      }
      break;
    case 0x1e911ad:
      local_3b0 = 0x3ff0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator+=<double,_nullptr>(in_stack_ffffffffffffd670,in_stack_ffffffffffffd668);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      for (local_3b4 = 0; local_3b4 < *(int *)(in_RDI + 0xc); local_3b4 = local_3b4 + 1) {
        local_428 = 0x400921fb54442d18;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        TPZVec<Fad<double>_>::operator[](local_98,(long)local_3b4);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd698,
                   (double)in_stack_ffffffffffffd690);
        sin<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadCst<double>>>
                  ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)in_stack_ffffffffffffd678);
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator*=
                  (in_stack_ffffffffffffd6a0,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffd698);
        FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
        ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
      }
      break;
    case 0x1e913de:
      local_450 = 0x3ff0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator+=<double,_nullptr>(in_stack_ffffffffffffd670,in_stack_ffffffffffffd668);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      for (local_454 = 0; local_454 < *(int *)(in_RDI + 0xc); local_454 = local_454 + 1) {
        local_4b8 = 0x400921fb54442d18;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        TPZVec<Fad<double>_>::operator[](local_98,(long)local_454);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator/<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_int,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd688,
                   (int)((ulong)in_stack_ffffffffffffd680 >> 0x20));
        cos<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadCst<int>>>
                  ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>
                    *)in_stack_ffffffffffffd668);
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator*=
                  (in_stack_ffffffffffffd6a0,
                   (FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>_>_>
                    *)in_stack_ffffffffffffd698);
        FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>_>_>
        ::~FadExpr((FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>::
        ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>
                  *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
      }
      break;
    case 0x1e9160c:
      local_528 = 0x3fe0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      operator-<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      operator*<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
                ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd698,
                 (double)in_stack_ffffffffffffd690);
      Fad<double>::
      Fad<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>,FadCst<double>>>
                (in_stack_ffffffffffffd690,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)in_stack_ffffffffffffd688);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
      ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      local_550 = 0x4024000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      local_5b4 = 1;
      Fad<double>::Fad<int,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,(int *)in_stack_ffffffffffffd648);
      local_5f0 = 0x3fd3333333333333;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      local_650 = 0x400921fb54442d18;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_98,0);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                 in_stack_ffffffffffffd670);
      sin<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>
                ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)in_stack_ffffffffffffd668);
      operator*<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_nullptr>
                (in_stack_ffffffffffffd678,
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd670);
      operator+<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_nullptr>
                (in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd670);
      local_684 = 1;
      Fad<double>::Fad<int,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,(int *)in_stack_ffffffffffffd648);
      local_6c0 = 0x3fe0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      local_720 = 0x400921fb54442d18;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                 in_stack_ffffffffffffd670);
      cos<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>
                ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)in_stack_ffffffffffffd668);
      operator*<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_nullptr>
                (in_stack_ffffffffffffd678,
                 (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd670);
      operator+<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_nullptr>
                (in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd670);
      operator*<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_nullptr>
                ((FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd670);
      Fad<double>::
      Fad<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>>>>>,FadExpr<FadBinaryAdd<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>>>>>>>
                (in_stack_ffffffffffffd690,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd688);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
      ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
      ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      atan<double>(in_stack_ffffffffffffd678);
      operator*<FadExpr<FadFuncAtan<Fad<double>_>_>,_Fad<double>,_nullptr>
                ((FadExpr<FadFuncAtan<Fad<double>_>_> *)in_stack_ffffffffffffd678,
                 in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator=
                (in_stack_ffffffffffffd660,
                 (FadExpr<FadBinaryMul<FadExpr<FadFuncAtan<Fad<double>_>_>,_Fad<double>_>_> *)
                 in_stack_ffffffffffffd658);
      FadExpr<FadBinaryMul<FadExpr<FadFuncAtan<Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadExpr<FadFuncAtan<Fad<double>_>_>,_Fad<double>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadFuncAtan<Fad<double>_>_>::~FadExpr
                ((FadExpr<FadFuncAtan<Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      break;
    case 0x1e91e44:
      local_760 = 0x4014000000000000;
      if (*(int *)(in_RDI + 0xc) == 1) {
        local_760 = 0x3ff4000000000000;
      }
      else if (*(int *)(in_RDI + 0xc) == 3) {
        local_760 = 0x4034000000000000;
      }
      local_788 = 0x3fe0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      local_7b0 = 0x4034000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      operator-<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                 in_stack_ffffffffffffd670);
      operator*<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
                (in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)in_stack_ffffffffffffd670);
      Fad<double>::
      Fad<FadBinaryMul<Fad<double>,FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>
                (in_stack_ffffffffffffd690,
                 (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd688);
      FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
      ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      local_828 = 0x3ff0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      for (local_82c = 0; local_82c < *(int *)(in_RDI + 0xc); local_82c = local_82c + 1) {
        TPZVec<Fad<double>_>::operator[](local_10,(long)local_82c);
        TPZVec<Fad<double>_>::operator[](local_10,(long)local_82c);
        operator-<double,_Fad<double>,_nullptr>
                  ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
        operator*<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
                   in_stack_ffffffffffffd670);
        Fad<double>::operator*=
                  (in_stack_ffffffffffffd6a0,
                   (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd698);
        FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
                   in_stack_ffffffffffffd640);
      }
      atan<double>(in_stack_ffffffffffffd678);
      operator+<double,_FadExpr<FadFuncAtan<Fad<double>_>_>,_nullptr>
                ((double)in_stack_ffffffffffffd688,
                 (FadExpr<FadFuncAtan<Fad<double>_>_> *)in_stack_ffffffffffffd680);
      Fad<double>::Fad<FadBinaryAdd<FadCst<double>,FadExpr<FadFuncAtan<Fad<double>>>>>
                (in_stack_ffffffffffffd690,
                 (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadFuncAtan<Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd688);
      FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadFuncAtan<Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadFuncAtan<Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadFuncAtan<Fad<double>_>_>::~FadExpr
                ((FadExpr<FadFuncAtan<Fad<double>_>_> *)in_stack_ffffffffffffd640);
      operator*<double,_Fad<double>,_nullptr>
                ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator=(in_stack_ffffffffffffd660,in_stack_ffffffffffffd658);
      FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      break;
    case 0x1e92368:
      TPZVec<Fad<double>_>::operator[](local_98,1);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      TPZVec<Fad<double>_>::operator[](local_98,0);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      atan2(__y,in_XMM1_Qa);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      RVar5 = shapeFAD::val<Fad<double>>((Fad<double> *)0x1e9240c);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      local_950 = RVar5;
      if (RVar5 < 0.0) {
        local_978[0] = 6.283185307179586;
        Fad<double>::operator+=(local_908,local_978);
      }
      if (((local_188 <= 0.0) || (1e-15 <= local_180)) || (local_180 <= -1e-15)) {
        local_9e8 = 0x4000000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        local_a10 = 0x4008000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator/<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        pow<Fad<double>,_FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
        Fad<double>::Fad<FadBinaryPow<Fad<double>,FadExpr<FadBinaryDiv<Fad<double>,Fad<double>>>>>
                  (in_stack_ffffffffffffd690,
                   (FadExpr<FadBinaryPow<Fad<double>,_FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd688);
        FadExpr<FadBinaryPow<Fad<double>,_FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>_>_>::
        ~FadExpr((FadExpr<FadBinaryPow<Fad<double>,_FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        local_a80 = 0x4000000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        local_aa8 = 0x4008000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator/<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                   in_stack_ffffffffffffd670);
        sin<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>
                  ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                    *)in_stack_ffffffffffffd668);
        operator*<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator=
                  (in_stack_ffffffffffffd660,
                   (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd658);
        FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
        ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
      }
      else {
        local_980 = 0;
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator=<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      }
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      break;
    case 0x1e92915:
      local_b30 = 0x400921fb54442d18;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      operator*<Fad<double>,_double,_nullptr>
                (in_stack_ffffffffffffd698,(double)in_stack_ffffffffffffd690);
      TPZVec<Fad<double>_>::operator[](local_98,0);
      operator*<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_stack_ffffffffffffd678,
                 in_stack_ffffffffffffd670);
      sin<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,FadCst<double>>>,Fad<double>>>
                ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>
                  *)in_stack_ffffffffffffd668);
      local_b98 = 0x400921fb54442d18;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      operator*<Fad<double>,_double,_nullptr>
                (in_stack_ffffffffffffd698,(double)in_stack_ffffffffffffd690);
      TPZVec<Fad<double>_>::operator[](local_98,1);
      operator*<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_stack_ffffffffffffd678,
                 in_stack_ffffffffffffd670);
      sin<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,FadCst<double>>>,Fad<double>>>
                ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>
                  *)in_stack_ffffffffffffd668);
      operator*<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_nullptr>
                ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd678,
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd670);
      local_bd0 = 0x3ff0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_98,0);
      TPZVec<Fad<double>_>::operator[](local_98,1);
      operator+<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      local_c18[0] = 0x3ff0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      operator+<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                 in_stack_ffffffffffffd670);
      operator/<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
                (in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)in_stack_ffffffffffffd670);
      operator+<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator=
                (in_stack_ffffffffffffd660,
                 (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd658);
      FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
      ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>::
      ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>::
      ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      break;
    case 0x1e92e61:
      local_d20 = local_d18;
      local_d28 = 0x3ff0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      local_d20 = (undefined8 *)local_cf8;
      local_d30 = 0x3fdc9f25c5bfedd8;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      local_d20 = (undefined8 *)local_cd8;
      local_d38 = 0x4002aaaaaaaaaaa9;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      local_d20 = (undefined8 *)local_cb8;
      local_d40 = 0xbfe7d9f4cf754632;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      local_d20 = (undefined8 *)local_c98;
      local_d48 = 0x3fe1c71c71c71c72;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      local_d20 = (undefined8 *)local_c78;
      local_d50 = 0xbfee363617d8d064;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      local_d20 = (undefined8 *)local_c58;
      local_d58 = 0xbfded097b425ed0e;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      local_d20 = (undefined8 *)local_c38;
      local_d60 = 0xc00336afe00206c6;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      local_d88 = 0x3fe122550cc9a902;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_98,1);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      TPZVec<Fad<double>_>::operator[](local_98,0);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      atan2(__y_00,in_XMM1_Qa);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      RVar5 = shapeFAD::val<Fad<double>>((Fad<double> *)0x1e930b6);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      local_df0 = RVar5;
      if (RVar5 < 0.0) {
        local_e18[0] = 6.283185307179586;
        Fad<double>::operator+=(&local_da8,local_e18);
      }
      if ((0.0 <= local_188) && (0.0 <= local_180)) {
        pow<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        cos<FadBinaryMul<Fad<double>,Fad<double>>>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
        operator*<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd670);
        Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        sin<FadBinaryMul<Fad<double>,Fad<double>>>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
        operator*<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd670);
        operator+<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator=
                  (in_stack_ffffffffffffd660,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd658);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      }
      if ((local_188 <= 0.0) && (0.0 <= local_180)) {
        pow<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        cos<FadBinaryMul<Fad<double>,Fad<double>>>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
        operator*<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd670);
        Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        sin<FadBinaryMul<Fad<double>,Fad<double>>>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
        operator*<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd670);
        operator+<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator=
                  (in_stack_ffffffffffffd660,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd658);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      }
      if ((local_188 < 0.0) && (local_180 <= 0.0)) {
        pow<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        cos<FadBinaryMul<Fad<double>,Fad<double>>>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
        operator*<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd670);
        Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        sin<FadBinaryMul<Fad<double>,Fad<double>>>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
        operator*<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd670);
        operator+<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator=
                  (in_stack_ffffffffffffd660,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd658);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      }
      if ((0.0 <= local_188) && (local_180 < 0.0)) {
        pow<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        cos<FadBinaryMul<Fad<double>,Fad<double>>>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
        operator*<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd670);
        Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        sin<FadBinaryMul<Fad<double>,Fad<double>>>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
        operator*<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd670);
        operator+<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator=
                  (in_stack_ffffffffffffd660,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd658);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      }
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      local_28b8 = local_c18;
      do {
        local_28b8 = local_28b8 + -4;
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
      } while (local_28b8 != local_d18);
      break;
    case 0x1e941b2:
      local_11bc = 2;
      Fad<double>::Fad<int,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,(int *)in_stack_ffffffffffffd648);
      local_11e4 = 5;
      Fad<double>::Fad<int,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,(int *)in_stack_ffffffffffffd648);
      if ((local_188 <= 0.0) && (local_180 <= 0.0)) {
        TPZVec<Fad<double>_>::operator[](local_98,0);
        local_1288 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator*<double,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_nullptr>
                  ((double)in_stack_ffffffffffffd688,
                   (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd680);
        operator+<Fad<double>,_double,_nullptr>
                  (in_stack_ffffffffffffd698,(double)in_stack_ffffffffffffd690);
        operator/<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_> *)in_stack_ffffffffffffd670
                  );
        sin<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,FadCst<double>>>>>
                  ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffd668);
        Fad<double>::
        Fad<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,FadCst<double>>>>>>>
                  (in_stack_ffffffffffffd690,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd688);
        FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_> *)in_stack_ffffffffffffd640
                  );
        FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>::
        ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        local_1318 = 0x4010000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        TPZVec<Fad<double>_>::operator[](local_98,1);
        local_1350 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator*<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_98,1);
        operator-<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670)
        ;
        local_13a8 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        local_13e0 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_nullptr>
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
        operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        Fad<double>::
        Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                  (in_stack_ffffffffffffd690,
                   (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd688);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640)
        ;
        FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>::
        ~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator=
                  (in_stack_ffffffffffffd660,
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd658);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
      }
      if ((0.0 < local_188) && (local_180 < 0.0)) {
        TPZVec<Fad<double>_>::operator[](local_98,0);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        local_14a0 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                   in_stack_ffffffffffffd670);
        operator*<double,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
                  ((double)in_stack_ffffffffffffd688,
                   (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                    *)in_stack_ffffffffffffd680);
        local_14d8 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator/<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
        sin<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>
                  ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd668);
        Fad<double>::
        Fad<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                  (in_stack_ffffffffffffd690,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd688);
        FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
        ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        local_1550 = 0x4010000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        TPZVec<Fad<double>_>::operator[](local_98,1);
        local_1588 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator*<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_98,1);
        operator-<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670)
        ;
        local_15e0 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        local_1618 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_nullptr>
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
        operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        Fad<double>::
        Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                  (in_stack_ffffffffffffd690,
                   (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd688);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640)
        ;
        FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>::
        ~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator=
                  (in_stack_ffffffffffffd660,
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd658);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
      }
      if ((local_188 < 0.0) && (0.0 <= local_180)) {
        TPZVec<Fad<double>_>::operator[](local_98,0);
        local_16c8 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator*<double,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_nullptr>
                  ((double)in_stack_ffffffffffffd688,
                   (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd680);
        local_1700 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator/<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
        sin<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>
                  ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd668);
        Fad<double>::
        Fad<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                  (in_stack_ffffffffffffd690,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd688);
        FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>::
        ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        local_1778 = 0x4010000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        TPZVec<Fad<double>_>::operator[](local_98,1);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        local_17c0 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                   in_stack_ffffffffffffd670);
        operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                    *)in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_98,1);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator-<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        local_1828 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        local_1860 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_nullptr>
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
        operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        Fad<double>::
        Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                  (in_stack_ffffffffffffd690,
                   (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd688);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::
        ~FadExpr((FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
        ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator=
                  (in_stack_ffffffffffffd660,
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd658);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
      }
      if ((0.0 <= local_188) && (0.0 <= local_180)) {
        TPZVec<Fad<double>_>::operator[](local_98,0);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        local_1920 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                   in_stack_ffffffffffffd670);
        operator*<double,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
                  ((double)in_stack_ffffffffffffd688,
                   (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                    *)in_stack_ffffffffffffd680);
        local_1958 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator/<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
        sin<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>
                  ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd668);
        Fad<double>::
        Fad<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                  (in_stack_ffffffffffffd690,
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd688);
        FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
        ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        local_19d0 = 0x4010000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        TPZVec<Fad<double>_>::operator[](local_98,1);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        local_1a18 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                   in_stack_ffffffffffffd670);
        operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                    *)in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_98,1);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator-<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        local_1a80 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        local_1ab8 = 0x3ff0000000000000;
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        operator+<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_nullptr>
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
        operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        Fad<double>::
        Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                  (in_stack_ffffffffffffd690,
                   (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd688);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::
        ~FadExpr((FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
        ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator=
                  (in_stack_ffffffffffffd660,
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd658);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
      }
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      break;
    case 0x1e9625f:
      this_00 = local_98;
      TPZVec<Fad<double>_>::operator[](this_00,0);
      TPZVec<Fad<double>_>::operator[](this_00,1);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_98,0);
      operator-<double,_Fad<double>,_nullptr>
                ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
      operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670
                );
      TPZVec<Fad<double>_>::operator[](local_98,1);
      operator-<double,_Fad<double>,_nullptr>
                ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
      operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670
                );
      Fad<double>::
      Fad<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>>>,FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>>>
                (in_stack_ffffffffffffd690,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd688);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640
                );
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640
                );
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      local_1bd8 = 0x4024000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_98,0);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      exp<FadBinaryMul<Fad<double>,Fad<double>>>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
      local_1c28 = 0x4024000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_98,1);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      exp<FadBinaryMul<Fad<double>,Fad<double>>>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
      operator*<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                ((FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd678,
                 (FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd670);
      Fad<double>::
      Fad<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>,FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>
                (in_stack_ffffffffffffd690,
                 (FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd688);
      FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      local_1c4c = 0x8354a;
      Fad<double>::Fad<int,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,(int *)in_stack_ffffffffffffd648);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      operator/<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                 in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator=
                (in_stack_ffffffffffffd660,
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)in_stack_ffffffffffffd658);
      FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
      ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      break;
    case 0x1e96835:
      TPZVec<Fad<double>_>::operator[](local_98,0);
      TPZVec<Fad<double>_>::operator[](local_98,1);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_98,2);
      operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                 in_stack_ffffffffffffd670);
      local_1cf8 = 0x3ff0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_98,0);
      operator-<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
      local_1d30 = 0x3ff0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_98,1);
      operator-<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
      local_1d68 = 0x3ff0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_98,2);
      operator-<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator=
                (in_stack_ffffffffffffd660,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd658);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
      ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      break;
    case 0x1e96c59:
      TPZVec<Fad<double>_>::operator[](local_98,0);
      TPZVec<Fad<double>_>::operator[](local_98,1);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      local_1dd0 = 0x3ff0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_98,0);
      operator-<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
      local_1e08 = 0x3ff0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_98,1);
      operator-<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator=
                (in_stack_ffffffffffffd660,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd658);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      break;
    case 0x1e96f11:
      local_1e60 = 0x4010000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      pow<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      Fad<double>::Fad<FadBinaryPow<Fad<double>,Fad<double>>>
                (in_stack_ffffffffffffd690,
                 (FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd688);
      FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      TPZVec<Fad<double>_>::operator[](local_98,1);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      TPZVec<Fad<double>_>::operator[](local_98,0);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      atan2(__y_01,in_XMM1_Qa);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      local_1f30 = 0x4000000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      sin<FadBinaryMul<Fad<double>,Fad<double>>>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
      operator*<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                (in_stack_ffffffffffffd678,
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd670);
      local_1f80 = 0x4000000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      cos<FadBinaryMul<Fad<double>,Fad<double>>>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
      operator*<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd678,
                 (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator=
                (in_stack_ffffffffffffd660,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd658);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      break;
    case 0x1e973b5:
      TPZVec<Fad<double>_>::operator[](local_10,0);
      operator*<double,_Fad<double>,_nullptr>
                ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
      exp<FadBinaryMul<FadCst<double>,Fad<double>>>
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678);
      TPZVec<Fad<double>_>::operator[](local_10,1);
      operator*<double,_Fad<double>,_nullptr>
                ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
      sin<FadBinaryMul<FadCst<double>,Fad<double>>>
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678);
      operator*<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
                ((FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd678,
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator=
                (in_stack_ffffffffffffd660,
                 (FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd658);
      FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      break;
    case 0x1e97577:
      local_2048 = 0x3fd0000000000000;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      local_2070 = 0x3ff921fb54442d18;
      Fad<double>::Fad<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      TPZVec<Fad<double>_>::operator[](local_10,0);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_10,0);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      cos<FadBinaryMul<Fad<double>,Fad<double>>>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
      operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                 (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_10,1);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      cosh<FadBinaryMul<Fad<double>,Fad<double>>>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
      operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd678,
                 (FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_10,1);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_10,0);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      sin<FadBinaryMul<Fad<double>,Fad<double>>>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
      operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_10,1);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      sinh<FadBinaryMul<Fad<double>,Fad<double>>>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
      operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd678,
                 (FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd670);
      operator+<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator=
                (in_stack_ffffffffffffd660,
                 (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd658);
      FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      break;
    case 0x1e97b47:
      TPZVec<Fad<double>_>::operator[](local_10,0);
      TPZVec<Fad<double>_>::operator[](local_10,0);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_10,1);
      TPZVec<Fad<double>_>::operator[](local_10,1);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      operator+<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
      sqrt<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
                ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd668);
      Fad<double>::
      Fad<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>
                (in_stack_ffffffffffffd690,
                 (FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd688);
      FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      TPZVec<Fad<double>_>::operator[](local_10,1);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      TPZVec<Fad<double>_>::operator[](local_10,0);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      atan2(__y_02,in_XMM1_Qa);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      pow(2.0,0.25);
      sqrt<double>(in_stack_ffffffffffffd678);
      operator*<double,_FadExpr<FadFuncSqrt<Fad<double>_>_>,_nullptr>
                ((double)in_stack_ffffffffffffd688,
                 (FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_ffffffffffffd680);
      operator/<Fad<double>,_int,_nullptr>
                (in_stack_ffffffffffffd688,(int)((ulong)in_stack_ffffffffffffd680 >> 0x20));
      cos<FadBinaryDiv<Fad<double>,FadCst<int>>>
                ((FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_> *)in_stack_ffffffffffffd668);
      operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd678,
                 (FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_> *)
                 in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator=
                (in_stack_ffffffffffffd660,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd658);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>::~FadExpr
                ((FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_> *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadFuncSqrt<Fad<double>_>_>::~FadExpr
                ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      break;
    case 0x1e97fe0:
      iVar3 = 0;
      TPZVec<Fad<double>_>::operator[](local_10,0);
      TPZVec<Fad<double>_>::operator[](local_10,iVar3);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      pFVar6 = (Fad<double> *)0x1;
      pFVar4 = TPZVec<Fad<double>_>::operator[](local_10,1);
      TPZVec<Fad<double>_>::operator[](local_10,(int64_t)pFVar6);
      operator*<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
      operator+<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
      sqrt<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
                ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd668);
      Fad<double>::
      Fad<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>
                (pFVar4,(FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                         *)pFVar6);
      FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      TPZVec<Fad<double>_>::operator[](local_10,1);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      TPZVec<Fad<double>_>::operator[](local_10,0);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      atan2(__y_03,in_XMM1_Qa);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      e = (FadExpr<FadFuncSqrt<Fad<double>_>_> *)
          shapeFAD::val<Fad<double>>((Fad<double> *)0x1e9818e);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      if (0.0 < (double)e) {
        local_23b8[0] = 6.283185307179586;
        Fad<double>::operator-=(local_2350,local_23b8);
      }
      pFVar4 = (Fad<double> *)pow(2.0,0.25);
      sqrt<double>(pFVar4);
      operator*<double,_FadExpr<FadFuncSqrt<Fad<double>_>_>,_nullptr>((double)pFVar6,e);
      operator/<Fad<double>,_int,_nullptr>(pFVar6,(int)((ulong)e >> 0x20));
      cos<FadBinaryDiv<Fad<double>,FadCst<int>>>
                ((FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_> *)in_stack_ffffffffffffd668);
      operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> *)
                 pFVar4,(FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_> *)
                        in_stack_ffffffffffffd670);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator=
                (in_stack_ffffffffffffd660,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd658);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>::~FadExpr
                ((FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_> *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadFuncSqrt<Fad<double>_>_>::~FadExpr
                ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      break;
    case 0x1e984dc:
      expr = (FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_> *)0x0;
      pFVar4 = TPZVec<Fad<double>_>::operator[](local_10,0);
      TPZVec<Fad<double>_>::operator[](local_10,(int64_t)expr);
      operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffd678,pFVar4);
      fadexpr = (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                 *)0x1;
      pFVar6 = TPZVec<Fad<double>_>::operator[](local_10,1);
      TPZVec<Fad<double>_>::operator[](local_10,(int64_t)fadexpr);
      operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffd678,pFVar4);
      operator+<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
                 (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)pFVar4);
      sqrt<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
                ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                  *)expr);
      Fad<double>::
      Fad<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>
                (in_stack_ffffffffffffd690,
                 (FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd688);
      FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
      TPZVec<Fad<double>_>::operator[](local_10,1);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      TPZVec<Fad<double>_>::operator[](local_10,0);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      atan2(__y_04,in_XMM1_Qa);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
      in_stack_ffffffffffffd650 =
           (TPZManVector<Fad<double>,_3> *)shapeFAD::val<Fad<double>>((Fad<double> *)0x1e9868a);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      if ((double)in_stack_ffffffffffffd650 < 0.0) {
        local_2528[0] = 6.283185307179586;
        Fad<double>::operator+=(local_24c0,local_2528);
      }
      pow(2.0,0.25);
      sqrt<double>(in_stack_ffffffffffffd678);
      operator*<double,_FadExpr<FadFuncSqrt<Fad<double>_>_>,_nullptr>
                ((double)in_stack_ffffffffffffd688,
                 (FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_ffffffffffffd680);
      operator/<Fad<double>,_int,_nullptr>
                (in_stack_ffffffffffffd688,(int)((ulong)in_stack_ffffffffffffd680 >> 0x20));
      cos<FadBinaryDiv<Fad<double>,FadCst<int>>>(expr);
      operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd678,
                 (FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_> *)pFVar4)
      ;
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator=(pFVar6,fadexpr);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
      FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>::~FadExpr
                ((FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_> *)in_stack_ffffffffffffd640);
      FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffd640);
      FadExpr<FadFuncSqrt<Fad<double>_>_>::~FadExpr
                ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
      break;
    case 0x1e989d8:
      Fad<double>::Fad((Fad<double> *)in_stack_ffffffffffffd650);
      TPZVec<Fad<double>_>::operator[](local_18,0);
      Fad<double>::operator=<double,_nullptr>
                ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
      for (local_25d4 = 1; local_25d4 < *(int *)(in_RDI + 0x210) + 1; local_25d4 = local_25d4 + 1) {
        Fad<double>::Fad<double,_nullptr>
                  ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
        tanh<double>(in_stack_ffffffffffffd678);
        operator/<int,_FadExpr<FadFuncTanh<Fad<double>_>_>,_nullptr>
                  ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),
                   (FadExpr<FadFuncTanh<Fad<double>_>_> *)in_stack_ffffffffffffd670);
        cos<double>(in_stack_ffffffffffffd678);
        operator*<double,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
                  ((double)in_stack_ffffffffffffd688,
                   (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffd680);
        operator-<double,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_nullptr>
                  ((double)in_stack_ffffffffffffd688,
                   (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd680);
        in_stack_ffffffffffffd640 = (Fad<double> *)((double)local_25d4 * 0.1591549430918954);
        sin<double>(in_stack_ffffffffffffd678);
        operator*<double,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
                  ((double)in_stack_ffffffffffffd688,
                   (FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffd680);
        operator-<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd670);
        operator*<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        operator*<Fad<double>,_int,_nullptr>
                  (in_stack_ffffffffffffd688,(int)((ulong)in_stack_ffffffffffffd680 >> 0x20));
        operator*<FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>,_int,_nullptr>
                  ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_> *)in_stack_ffffffffffffd688,
                   (int)((ulong)in_stack_ffffffffffffd680 >> 0x20));
        operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>,_FadCst<int>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>,_FadCst<int>_>_>
                    *)in_stack_ffffffffffffd670);
        Fad<double>::
        Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,FadExpr<FadFuncTanh<Fad<double>>>>>,FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadFuncCos<Fad<double>>>>>>>,FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadFuncSin<Fad<double>>>>>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,FadCst<int>>>,FadCst<int>>>>>
                  (in_stack_ffffffffffffd690,
                   (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>,_FadCst<int>_>_>_>_>
                    *)in_stack_ffffffffffffd688);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>,_FadCst<int>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>,_FadCst<int>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>,_FadCst<int>_>_>::
        ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>,_FadCst<int>_>_>
                  *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_> *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd640);
        FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd640);
        FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd640);
        FadExpr<FadFuncTanh<Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadFuncTanh<Fad<double>_>_> *)in_stack_ffffffffffffd640);
        cosh<double>(in_stack_ffffffffffffd678);
        operator/<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadFuncCosh<Fad<double>_>_> *)in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_10,0);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
        cos<FadBinaryMul<Fad<double>,Fad<double>>>
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd668);
        operator*<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd678,
                   (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_10,1);
        operator-<Fad<double>,_int,_nullptr>
                  (in_stack_ffffffffffffd688,(int)((ulong)in_stack_ffffffffffffd680 >> 0x20));
        operator*<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>,_nullptr>
                  (in_stack_ffffffffffffd678,
                   (FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_> *)in_stack_ffffffffffffd670)
        ;
        cosh<FadBinaryMul<Fad<double>,FadExpr<FadBinaryMinus<Fad<double>,FadCst<int>>>>>
                  ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>
                    *)in_stack_ffffffffffffd668);
        operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd678,
                   (FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd670);
        TPZVec<Fad<double>_>::operator[](local_18,0);
        Fad<double>::operator+=
                  (in_stack_ffffffffffffd670,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd668);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>::
        ~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>
                  *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_> *)in_stack_ffffffffffffd640)
        ;
        FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffd640);
        FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd640);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
        FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffd640);
        FadExpr<FadFuncCosh<Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadFuncCosh<Fad<double>_>_> *)in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
        Fad<double>::~Fad(in_stack_ffffffffffffd640);
      }
      Fad<double>::~Fad(in_stack_ffffffffffffd640);
    }
  }
  else {
    TPZVec<Fad<double>_>::operator[](local_18,0);
    Fad<double>::operator=<double,_nullptr>
              ((Fad<double> *)in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
  }
  Fad<double>::~Fad(in_stack_ffffffffffffd640);
  Fad<double>::~Fad(in_stack_ffffffffffffd640);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_ffffffffffffd650);
  return;
}

Assistant:

void TLaplaceExample1::uxy(const TPZVec<TVar> &x, TPZVec<TVar> &disp) const
{
    TPZManVector<TVar,3> xloc(x);
    for (int i = 0; i<xloc.size(); i++) {
        xloc[i] -= fCenter[i];
    }
    TVar r2 = 0.;
    for (int i=0; i<fDimension; i++) {
        r2 += xloc[i]*xloc[i];
    }
    TVar r = sqrt(r2);
    disp[0] = xloc[0]*(TVar)(0.);
    
    REAL xval[2] = {shapeFAD::val(x[0]),shapeFAD::val(x[1])};
     
    switch (fExact) {
        case EConst:
            disp[0] += gC;
            break;
        case EX:
            disp[0] += xloc[0];
            break;
        case ESinSin:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]);
        }
            break;
        case E10SinSin:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]*10.);
        }
            break;
            
            case E2SinSin:
            {
                disp[0] += (TVar)(1.);
                for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]*2.);
            }
                break;
        case ESinDist:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]*1.1);
        }
            break;
        case ECosCos:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= cos((TVar)M_PI*xloc[i]/2);
        }
            break;
        case EArcTan://(1+0.3sin(10Pi x))*(1+0.5cos(10Pi r)*arctan(100*(r-0.5))
        {
            TVar atanco = (r-(TVar)0.5)*100.;
            TVar freq = 10.;
            TVar mult = (TVar(1)+TVar(0.3)*sin(TVar(M_PI)*xloc[0]*freq))*(TVar(1)+TVar(0.5)*cos(TVar(M_PI)*r*freq));
            disp[0] = atan(atanco)*mult;
        }
            break;
        case EArcTanSingular://5*(0.5*pi + arctang(20(0.25 - r^2))))
        {
            REAL B = 5.;
            if(fDimension==1)
                B *= 0.25;
            else if(fDimension==3)
                B *= 4;
            // Argument value (arc) to compute ArcTangent( arc )
            TVar RCircle = 0.5;
            TVar Force = 20.;
            TVar arc = Force*(RCircle*RCircle-r2);
            TVar Prod = 1.;
            for (int i=0; i<fDimension; i++) {
                Prod *= x[i]*(1.-x[i]);
            }
            TVar temp = 0.5*M_PI + atan(arc);
            disp[0] = B*temp;
        }
            break;
            
            //----
        case ESinMark://(r^(2/3)-r^2)sin(20/3) para homogeneo dirichlet e r^(2/3)sin(20/3) para f=0
        {

            TVar theta = atan2(xloc[1], xloc[0]);//theta=arctan(y/x)
            auto thetaval = shapeFAD::val(theta);
            if (thetaval < (0.)) theta += 2. * M_PI;

            // Verification to avoid numerical errors when x > 0 and y = 0
            if (xval[0] > 0 && xval[1] < 1e-15 && xval[1] > -1.e-15) {
               disp[0] = 0.;
            }
            else {
                TVar factor = pow(r,TVar (2.)/TVar (3.));//pow(r,TVar (2.)/TVar (3.))-pow(r,TVar (2.));//
                disp[0] = factor * (sin((TVar) (2.) * theta / TVar(3.)));
            }


        }
            break;
            
            //--
     
        case ESinSinDirNonHom: //sin(2 pi x)sin(2pi y)+1/(x+y+1)
        {
            
            disp[0]=(sin((TVar)M_PI*2.*xloc[0]))*sin((TVar)M_PI*2.*xloc[1])+(TVar)1./(xloc[0]+xloc[1]+(TVar)(1.));
            
        }
            
            break;
            
        case ESteklovNonConst://Steklov function for eigenvalue lambda=0.53544094560246 and permeability Omega1=Omega=3, Omega2=Omega4=5
        {
            TVar coefs[] = {1., 0.44721359549995787, 2.3333333333333326,
                -0.7453559924999296, 0.5555555555555556,
                -0.9441175904999111, -0.48148148148148173,
                -2.4017026424997736};
            TVar lambda = 0.53544094560246;
            TVar t = atan2(xloc[1], xloc[0]);
            REAL tval = shapeFAD::val(t);
            if(tval < (0.)) t += 2.*M_PI;
            
            if((xval[0] >=(0.)) && (xval[1] >=(0.))){
               // std::cout<<"1o. Q "<<xloc<< " r " << r << " th " << t << std::endl;
                
                disp[0]=pow(r, lambda)*(TVar(coefs[0])*cos(lambda *t) + TVar(coefs[1])*sin(lambda*t) );
               // std::cout<<"valor da funcao no 1o. Q "<<disp[0]<<std::endl;
               // disp[0]=pow(r, lambda)*(cos(lambda *t)+TVar(-1.)*TVar(0.1)*sin(lambda*t));
                
            }
            
            if(( xval[0] <= (0.)) && (xval[1] >=(0.))){
               // std::cout<<"2o. Q "<<xloc<< " r " << r << " th " << t << std::endl;
                
                disp[0]= pow(r, lambda)*(TVar(coefs[2])*cos(lambda*t) + TVar(coefs[3])*sin(lambda* t));
                
             //    std::cout<<"valor da funcao no 2o. Q "<<disp[0]<<std::endl;
            }
            
            if((xval[0] <(0.)) && ( xval[1] <= (0.))){
               // std::cout<<"3o. Q "<<xloc<< " r " << r << " th " << t << std::endl;
                disp[0]= pow(r, lambda)*(TVar(coefs[4] )*cos(lambda*t) + TVar(coefs[5])*sin(lambda* t));
                //disp[0]= pow(r, lambda)*(TVar(-1.)*TVar(0.882757 )*cos(lambda*t) + TVar(-1.)*TVar(0.480355)*sin(lambda* t));
              //   std::cout<<"valor da funcao no 3o. Q "<<disp[0]<<std::endl;
            }
            if(( xval[0] >= (0.)) && ( xval[1] < (0.))){
              //  std::cout<<"4o. Q "<<xloc<< " r " << r << " th " << t << std::endl;

                disp[0]= pow(r, lambda)*(TVar(coefs[6])*cos(lambda*t) +  TVar(coefs[7])*sin(lambda* t));
                
               // std::cout<<"valor da funcao no 4o. Q "<<disp[0]<<std::endl;
                
            }
            
            
        }
            break;
            
            case EGalvisNonConst:
        {
            
            TVar k1 = 2;
            TVar k2 = 5;
            
            
            if((xval[0] <= (0.)) && (xval[1] <= (0.))){
                
                TVar u1 = sin(M_PI*(xloc[0]+TVar(1.))/(k1+1.));
                TVar u2 = TVar(4.)*(xloc[1]+TVar(1.))*(k2-xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
           //     std::cout<<"3o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
            }
            
            if(( xval[0] > (0.)) && (xval[1] < (0.))){
             
                
                TVar u1 = sin(M_PI*(k1*xloc[0]+TVar(1.))/(k1 + TVar(1.)));
                TVar u2 = TVar(4.)*(xloc[1]+TVar(1.))*(k2-xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
           //     std::cout<<"4o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
            }
            
            if((xval[0] < (0.)) && ( xval[1] >= (0.))){
              
                TVar u1 = sin(M_PI*(xloc[0]+TVar(1.))/(k1+TVar(1.)));
                TVar u2 = TVar(4.)*(k2*xloc[1]+TVar(1.))*(k2-k2*xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
           //     std::cout<<"2o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
            }
            if(( xval[0] >= (0.)) && ( xval[1] >= (0.))){
               
                
                TVar u1 = sin(M_PI*(k1*xloc[0]+TVar(1.))/(k1+TVar(1.)));
                TVar u2 = TVar(4.)*(k2*xloc[1]+TVar(1.))*(k2-k2*xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
            //    std::cout<<"1o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
                
            }
            
            
        }
            break;
            
        case EBoundaryLayer:{
            TVar term1 = xloc[0]*xloc[1]*(1.-xloc[0])*(1.-xloc[1]);
            TVar term2 = exp(TVar(10.)*xloc[0])*exp(TVar(10.)*xloc[1]);
            TVar factor = TVar(537930);
            
            disp[0] = (term1*term2)/factor;
            
          //  std::cout<<"Pto "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
            
            
        }
            break;
            
        case EBubble:{
            
            disp[0] = xloc[0]*xloc[1]*xloc[2]*(TVar(1.)-xloc[0])*(TVar(1.)-xloc[1])*(TVar(1.)-xloc[2]);
           // std::cout<<"pto "<<xloc <<" f(x) "<<disp<<std::endl;
        }
            break;
        case EBubble2D:{

            disp[0] = xloc[0]*xloc[1]*(TVar(1.)-xloc[0])*(TVar(1.)-xloc[1]);
        }
            break;
        case ESinCosCircle:{
            
            TVar coef = pow(r, TVar(4.));
            TVar theta=atan2(xloc[1],xloc[0]);
            disp[0] = coef*sin(TVar(2.)*theta)*cos(TVar(2.)*theta);
            
            
        }
            break;
        case EHarmonic:
            disp[0] = exp(M_PI*x[0])*sin(M_PI*x[1]);
            break;

        case EHarmonic2:
        {
            TVar a1 = 1./4;
            TVar alpha = M_PI/2;
            disp[0] = x[0]*a1*cos(x[0]*alpha)*cosh(x[1]*alpha) + x[1]*a1*sin(x[0]*alpha)*sinh(x[1]*alpha);
        }
            break;
        case ESquareRoot:
        {
            TVar r = sqrt(x[0]*x[0]+x[1]*x[1]);
            TVar theta = atan2(x[1],x[0]);
            disp[0] = pow(2.,1/4.)*sqrt(r)*cos(theta/2);
            //disp[0] = pow(2.,-1/4.)*sqrt(x[0] + sqrt(x[0]*x[0] + x[1]*x[1]));
        }
            break;

        case ESquareRootLower:
        {
            TVar r = sqrt(x[0]*x[0]+x[1]*x[1]);
            TVar theta = atan2(x[1],x[0]);
            if (shapeFAD::val(theta) > 0.) {
                theta -= (2.*M_PI);
            }
            disp[0] = pow(2.,1/4.)*sqrt(r)*cos(theta/2);
            //disp[0] = pow(2.,-1/4.)*sqrt(x[0] + sqrt(x[0]*x[0] + x[1]*x[1]));
        }
            break;

        case ESquareRootUpper:
        {
            TVar r = sqrt(x[0]*x[0]+x[1]*x[1]);
            TVar theta = atan2(x[1],x[0]);
            if (shapeFAD::val(theta) < 0.) {
                theta += (2.*M_PI);
            }
            disp[0] = pow(2.,1/4.)*sqrt(r)*cos(theta/2);
            //disp[0] = pow(2.,-1/4.)*sqrt(x[0] + sqrt(x[0]*x[0] + x[1]*x[1]));
        }
            break;

        case ELaplace2D:
        {
            TVar Ck;
            disp[0] = 1.;
            for(int k = 1 ; k < fmaxIter+1; k++){
                TVar kpi = k*M_PI;
                TVar ck = -2/tanh(kpi)*(0.1013211836423378 -0.1013211836423378*cos(kpi)-0.1591549430918954 *k* sin(kpi))/(kpi*k*k);
                disp[0]+=ck/cosh(kpi)*cos(kpi*x[0])*cosh(kpi*(x[1]-1));
            }
        }
            break;

        default:
            disp[0] = 0.;
            break;
    }
}